

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O1

VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
 Lib::
 VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
 ::getEmpty(void)

{
  int *piVar1;
  VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
  VVar2;
  int iVar3;
  IteratorCore<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
  *in_RDI;
  
  if (VirtualIterator<std::pair<std::pair<Kernel::Clause*,Kernel::Literal*>,Kernel::RobSubstitution*>>
      ::getEmpty()::inst == '\0') {
    iVar3 = __cxa_guard_acquire(&VirtualIterator<std::pair<std::pair<Kernel::Clause*,Kernel::Literal*>,Kernel::RobSubstitution*>>
                                 ::getEmpty()::inst);
    if (iVar3 != 0) {
      getEmpty::inst._core =
           (IteratorCore<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
            *)FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      (getEmpty::inst._core)->_refCnt = 0;
      (getEmpty::inst._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b64308;
      (getEmpty::inst._core)->_refCnt = 1;
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<std::pair<std::pair<Kernel::Clause*,Kernel::Literal*>,Kernel::RobSubstitution*>>
                           ::getEmpty()::inst);
    }
  }
  VVar2._core = getEmpty::inst._core;
  in_RDI->_vptr_IteratorCore = (_func_int **)getEmpty::inst._core;
  if (VVar2._core !=
      (IteratorCore<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
       *)0x0) {
    piVar1 = &(VVar2._core)->_refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<std::pair<std::pair<Kernel::Clause_*,_Kernel::Literal_*>,_Kernel::RobSubstitution_*>_>
          )in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }